

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv4destination.h
# Opt level: O0

bool jrtplib::RTPIPv4Destination::AddressToDestination(RTPAddress *addr,RTPIPv4Destination *dest)

{
  AddressType AVar1;
  uint32_t ip;
  RTPIPv4Destination local_50;
  uint16_t local_2c;
  uint16_t local_2a;
  uint16_t rtcpport;
  RTPIPv4Destination *pRStack_28;
  uint16_t rtpport;
  RTPIPv4Address *address;
  RTPIPv4Destination *dest_local;
  RTPAddress *addr_local;
  
  address = (RTPIPv4Address *)dest;
  dest_local = (RTPIPv4Destination *)addr;
  AVar1 = RTPAddress::GetAddressType(addr);
  if (AVar1 == IPv4Address) {
    pRStack_28 = dest_local;
    local_2a = RTPIPv4Address::GetPort((RTPIPv4Address *)dest_local);
    local_2c = RTPIPv4Address::GetRTCPSendPort((RTPIPv4Address *)pRStack_28);
    ip = RTPIPv4Address::GetIP((RTPIPv4Address *)pRStack_28);
    RTPIPv4Destination(&local_50,ip,local_2a,local_2c);
    memcpy(address,&local_50,0x24);
  }
  return AVar1 == IPv4Address;
}

Assistant:

static bool AddressToDestination(const RTPAddress &addr, RTPIPv4Destination &dest)
	{
		if (addr.GetAddressType() != RTPAddress::IPv4Address)
			return false;

		const RTPIPv4Address &address = (const RTPIPv4Address &)addr;
		uint16_t rtpport = address.GetPort();
		uint16_t rtcpport = address.GetRTCPSendPort();

		dest = RTPIPv4Destination(address.GetIP(),rtpport,rtcpport);
		return true;
	}